

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_shl16v_mips64el(void *d,void *a,void *b,uint32_t desc)

{
  intptr_t oprsz_00;
  long lStack_38;
  uint8_t sh;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *b_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (lStack_38 = 0; lStack_38 < oprsz_00; lStack_38 = lStack_38 + 2) {
    *(short *)((long)d + lStack_38) =
         *(short *)((long)a + lStack_38) << ((byte)*(undefined2 *)((long)b + lStack_38) & 0xf);
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_shl16v)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint16_t)) {
        uint8_t sh = *(uint16_t *)((char *)b + i) & 15;
        *(uint16_t *)((char *)d + i) = *(uint16_t *)((char *)a + i) << sh;
    }
    clear_high(d, oprsz, desc);
}